

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_stored_session_ticket
              (ptls_t *tls,ptls_key_exchange_algorithm_t **key_share,ptls_cipher_suite_t **cs,
              ptls_iovec_t *secret,uint32_t *obfuscated_ticket_age,ptls_iovec_t *ticket,
              uint32_t *max_early_data_size,uint8_t *src,uint8_t *end)

{
  uint32_t *puVar1;
  uint8_t *puVar2;
  ulong uVar3;
  uint8_t *puVar4;
  ptls_iovec_t pVar5;
  long *local_e0;
  ptls_cipher_suite_t **cand_1;
  ptls_key_exchange_algorithm_t **cand;
  size_t local_c8;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  undefined1 local_68 [4];
  int ret;
  ptls_iovec_t nonce;
  uint64_t now;
  uint64_t obtained_at;
  uint32_t local_40;
  uint32_t age_add;
  uint32_t lifetime;
  uint16_t csid;
  uint16_t kxid;
  ptls_iovec_t *ticket_local;
  uint32_t *obfuscated_ticket_age_local;
  ptls_iovec_t *secret_local;
  ptls_cipher_suite_t **cs_local;
  ptls_key_exchange_algorithm_t **key_share_local;
  ptls_t *tls_local;
  
  _lifetime = ticket;
  ticket_local = (ptls_iovec_t *)obfuscated_ticket_age;
  obfuscated_ticket_age_local = (uint32_t *)secret;
  secret_local = (ptls_iovec_t *)cs;
  cs_local = (ptls_cipher_suite_t **)key_share;
  key_share_local = (ptls_key_exchange_algorithm_t **)tls;
  _capacity._4_4_ = ptls_decode64(&now,&src,end);
  if (((_capacity._4_4_ == 0) &&
      (_capacity._4_4_ = ptls_decode16((uint16_t *)((long)&age_add + 2),&src,end),
      _capacity._4_4_ == 0)) &&
     (_capacity._4_4_ = ptls_decode16((uint16_t *)&age_add,&src,end), _capacity._4_4_ == 0)) {
    _block_size = 3;
    if ((ulong)((long)end - (long)src) < 3) {
      _capacity._4_4_ = 0x32;
    }
    else {
      _block_size64 = 0;
      do {
        puVar4 = src + 1;
        _block_size64 = _block_size64 << 8 | (ulong)*src;
        _block_size = _block_size - 1;
        src = puVar4;
      } while (_block_size != 0);
      if ((ulong)((long)end - (long)puVar4) < _block_size64) {
        _capacity._4_4_ = 0x32;
      }
      else {
        puVar2 = puVar4 + _block_size64;
        _capacity._4_4_ =
             decode_new_session_ticket
                       ((ptls_t *)key_share_local,&local_40,(uint32_t *)((long)&obtained_at + 4),
                        (ptls_iovec_t *)local_68,_lifetime,max_early_data_size,puVar4,puVar2);
        puVar1 = obfuscated_ticket_age_local;
        if (_capacity._4_4_ == 0) {
          _block_size_1 = 2;
          if ((ulong)((long)end - (long)puVar2) < 2) {
            _capacity._4_4_ = 0x32;
          }
          else {
            _block_size64_1 = 0;
            src = puVar2;
            do {
              puVar4 = src + 1;
              _block_size64_1 = _block_size64_1 << 8 | (ulong)*src;
              _block_size_1 = _block_size_1 - 1;
              src = puVar4;
            } while (_block_size_1 != 0);
            if ((ulong)((long)end - (long)puVar4) < _block_size64_1) {
              _capacity._4_4_ = 0x32;
            }
            else {
              puVar2 = puVar4 + _block_size64_1;
              pVar5 = ptls_iovec_init(puVar4,(long)puVar2 - (long)puVar4);
              cand = (ptls_key_exchange_algorithm_t **)pVar5.base;
              *(ptls_key_exchange_algorithm_t ***)puVar1 = cand;
              local_c8 = pVar5.len;
              *(size_t *)(puVar1 + 2) = local_c8;
              if (puVar2 == end) {
                for (cand_1 = (ptls_cipher_suite_t **)(*key_share_local)->exchange;
                    (*cand_1 != (ptls_cipher_suite_t *)0x0 && ((*cand_1)->id != age_add._2_2_));
                    cand_1 = cand_1 + 1) {
                }
                if (*cand_1 == (ptls_cipher_suite_t *)0x0) {
                  _capacity._4_4_ = 0x203;
                }
                else {
                  *cs_local = *cand_1;
                  for (local_e0 = (long *)(*key_share_local)->data;
                      (*local_e0 != 0 && (*(short *)*local_e0 != (short)age_add));
                      local_e0 = local_e0 + 1) {
                  }
                  if (*local_e0 == 0) {
                    _capacity._4_4_ = 0x203;
                  }
                  else {
                    secret_local->base = (uint8_t *)*local_e0;
                    src = puVar2;
                    uVar3 = (**(code **)(*key_share_local)->create)((*key_share_local)->create);
                    if ((uVar3 < now) || (0x240c83ff < uVar3 - now)) {
                      _capacity._4_4_ = 0x203;
                    }
                    else {
                      *(int *)&ticket_local->base = ((int)uVar3 - (int)now) + obtained_at._4_4_;
                      _capacity._4_4_ = 0;
                    }
                  }
                }
              }
              else {
                _capacity._4_4_ = 0x32;
              }
            }
          }
        }
      }
    }
  }
  return _capacity._4_4_;
}

Assistant:

static int decode_stored_session_ticket(ptls_t *tls, ptls_key_exchange_algorithm_t **key_share, ptls_cipher_suite_t **cs,
                                        ptls_iovec_t *secret, uint32_t *obfuscated_ticket_age, ptls_iovec_t *ticket,
                                        uint32_t *max_early_data_size, const uint8_t *src, const uint8_t *const end)
{
    uint16_t kxid, csid;
    uint32_t lifetime, age_add;
    uint64_t obtained_at, now;
    ptls_iovec_t nonce;
    int ret;

    /* decode */
    if ((ret = ptls_decode64(&obtained_at, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode16(&kxid, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode16(&csid, &src, end)) != 0)
        goto Exit;
    ptls_decode_open_block(src, end, 3, {
        if ((ret = decode_new_session_ticket(tls, &lifetime, &age_add, &nonce, ticket, max_early_data_size, src, end)) != 0)
            goto Exit;
        src = end;
    });
    ptls_decode_block(src, end, 2, {
        *secret = ptls_iovec_init(src, end - src);
        src = end;
    });

    { /* determine the key-exchange */
        ptls_key_exchange_algorithm_t **cand;
        for (cand = tls->ctx->key_exchanges; *cand != NULL; ++cand)
            if ((*cand)->id == kxid)
                break;
        if (*cand == NULL) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        *key_share = *cand;
    }

    { /* determine the cipher-suite */
        ptls_cipher_suite_t **cand;
        for (cand = tls->ctx->cipher_suites; *cand != NULL; ++cand)
            if ((*cand)->id == csid)
                break;
        if (*cand == NULL) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        *cs = *cand;
    }

    /* calculate obfuscated_ticket_age */
    now = tls->ctx->get_time->cb(tls->ctx->get_time);
    if (!(obtained_at <= now && now - obtained_at < 7 * 86400 * 1000)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    *obfuscated_ticket_age = (uint32_t)(now - obtained_at) + age_add;

    ret = 0;
Exit:
    return ret;
}